

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O0

Result __thiscall
wabt::interp::Memory::AtomicRmwCmpxchg<unsigned_char>
          (Memory *this,u32 offset,u32 addend,uchar expect,uchar replace,uchar *out)

{
  bool bVar1;
  Result RVar2;
  uchar local_31;
  uchar *puStack_30;
  uchar read;
  uchar *out_local;
  u32 local_20;
  uchar replace_local;
  u32 uStack_1c;
  uchar expect_local;
  u32 addend_local;
  u32 offset_local;
  Memory *this_local;
  
  puStack_30 = out;
  out_local._6_1_ = replace;
  out_local._7_1_ = expect;
  local_20 = addend;
  uStack_1c = offset;
  _addend_local = this;
  RVar2 = AtomicLoad<unsigned_char>(this,offset,addend,&local_31);
  bVar1 = Failed(RVar2);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    if (local_31 == out_local._7_1_) {
      RVar2 = AtomicStore<unsigned_char>(this,uStack_1c,local_20,out_local._6_1_);
      bVar1 = Failed(RVar2);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        return (Result)this_local._4_4_;
      }
    }
    *puStack_30 = local_31;
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result Memory::AtomicRmwCmpxchg(u32 offset,
                                u32 addend,
                                T expect,
                                T replace,
                                T* out) {
  T read;
  CHECK_RESULT(AtomicLoad(offset, addend, &read));
  if (read == expect) {
    CHECK_RESULT(AtomicStore(offset, addend, replace));
  }
  *out = read;
  return Result::Ok;
}